

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::TTDebuggerSourceLocation::SetLocationFullRaw
          (TTDebuggerSourceLocation *this,TTD_LOG_PTR_ID sourceScriptLogId,int64 etime,int64 ftime,
          int64 ltime,uint32 topLevelBodyId,uint32 functionLine,uint32 functionColumn,ULONG line,
          LONG column)

{
  uint32 in_stack_00000008;
  
  this->m_sourceScriptLogId = sourceScriptLogId;
  this->m_bpId = -1;
  this->m_etime = etime;
  this->m_ftime = ftime;
  this->m_ltime = ltime;
  this->m_topLevelBodyId = topLevelBodyId;
  this->m_functionLine = in_stack_00000008;
  this->m_functionColumn = functionLine;
  this->m_line = functionColumn;
  this->m_column = line;
  return;
}

Assistant:

void TTDebuggerSourceLocation::SetLocationFullRaw(TTD_LOG_PTR_ID sourceScriptLogId, int64 etime, int64 ftime, int64 ltime, uint32 topLevelBodyId, uint32 functionLine, uint32 functionColumn, ULONG line, LONG column)
    {
        this->m_sourceScriptLogId = sourceScriptLogId;
        this->m_bpId = -1;

        this->m_etime = etime;
        this->m_ftime = ftime;
        this->m_ltime = ltime;

        this->m_topLevelBodyId = topLevelBodyId;

        this->m_functionLine = functionLine;
        this->m_functionColumn = functionColumn;

        this->m_line = (uint32)line;
        this->m_column = (uint32)column;
    }